

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall Client::run(Client *this)

{
  char **ppcVar1;
  bool bVar2;
  __pid_t _Var3;
  uint uVar4;
  int iVar5;
  epoll_event *peVar6;
  ulong extraout_RAX;
  ssize_t sVar7;
  int *piVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char **ppcVar12;
  Client *pCVar13;
  ulong uVar14;
  ulong uVar15;
  Client *this_00;
  uint uVar16;
  int iVar17;
  
  Epoll::add_event(&this->_epoll,this->_sock_fd,1);
  Epoll::add_event(&this->_epoll,0,1);
  do {
    do {
      _Var3 = Epoll::wait(&this->_epoll,(void *)0x3e8);
      bVar2 = 0 < _Var3;
    } while (_Var3 < 1);
    iVar17 = 0;
    do {
      peVar6 = Epoll::get(&this->_epoll,iVar17);
      if ((peVar6->events & 1) == 0) {
        if (((peVar6->events & 4) != 0) && (run(), (extraout_RAX & 1) == 0)) {
LAB_00101fac:
          if (bVar2) {
            return;
          }
          break;
        }
      }
      else {
        uVar16 = (peVar6->data).fd;
        fprintf(_stderr,"%s(%d)-<%s>: epollin fd %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0x3c,"run",(ulong)uVar16);
        fflush(_stderr);
        uVar4 = do_recv(this,uVar16);
        if (uVar4 == 0) {
          uVar4 = this->_sock_fd;
          if (uVar16 == 0) {
LAB_00101f9a:
            Epoll::modify_event(&this->_epoll,uVar4,4);
          }
          else if (uVar16 == uVar4) {
            Epoll::add_event(&this->_epoll,1,4);
          }
        }
        else {
          if (0xfffffffd < uVar4) goto LAB_00101fac;
          if (uVar4 != 0xfffffffa) goto LAB_00101e77;
          if ((uVar16 == 0) && ((this->_stdin2sock)._r_pos != (this->_stdin2sock)._w_pos)) {
            uVar4 = this->_sock_fd;
            goto LAB_00101f9a;
          }
          if (((uVar16 == this->_sock_fd) &&
              ((this->_sock2stdout)._r_pos != (this->_sock2stdout)._w_pos)) &&
             (iVar5 = Epoll::add_event(&this->_epoll,1,4), iVar5 < 0)) {
            uVar14 = 1;
            pCVar13 = this;
            iVar5 = Epoll::modify_event(&this->_epoll,1,4);
            if (iVar5 < 0) {
              run();
              iVar5 = (int)uVar14;
              iVar17 = pCVar13->_sock_fd;
              ppcVar12 = &(pCVar13->_sock2stdout)._r_pos;
              if (((iVar17 == iVar5) && (ppcVar12 == (char **)(pCVar13->_sock2stdout)._r_pos)) ||
                 ((ppcVar1 = &(pCVar13->_stdin2sock)._r_pos, iVar5 == 0 &&
                  (ppcVar1 == (char **)(pCVar13->_stdin2sock)._r_pos)))) {
                if (iVar17 != iVar5) {
                  if (iVar5 != 0) {
                    return;
                  }
                  do_recv();
                  return;
                }
LAB_0010209f:
                do_recv();
                return;
              }
              uVar15 = CONCAT71((int7)(uVar14 >> 8),iVar17 == iVar5 || iVar5 == 0);
              if (iVar17 == iVar5 || iVar5 == 0) {
                if (iVar17 != iVar5) {
                  iVar17 = 0;
                  ppcVar12 = ppcVar1;
                }
                sVar7 = read(iVar17,*ppcVar12,(long)ppcVar12 - (long)*ppcVar12);
                uVar16 = (uint)sVar7;
                if (-1 < (int)uVar16) {
                  if (uVar16 != 0) {
                    fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                            ,0xc6,"do_recv",uVar14 & 0xffffffff,uVar16);
                    fflush(_stderr);
                    if (pCVar13->_sock_fd == iVar5) {
                      ppcVar12 = &(pCVar13->_sock2stdout)._r_pos;
                      *ppcVar12 = *ppcVar12 + (uVar16 & 0x7fffffff);
                      return;
                    }
                    if (iVar5 != 0) {
                      return;
                    }
                    ppcVar12 = &(pCVar13->_stdin2sock)._r_pos;
                    *ppcVar12 = *ppcVar12 + (uVar16 & 0x7fffffff);
                    return;
                  }
                  if (pCVar13->_sock_fd == iVar5) {
                    do_recv(pCVar13);
                    return;
                  }
                  if (iVar5 != 0) {
                    return;
                  }
                  do_recv();
                  return;
                }
                piVar8 = __errno_location();
                if (*piVar8 == 0xb) {
                  return;
                }
                do_recv();
                goto LAB_0010209f;
              }
              this_00 = (Client *)(uVar14 & 0xffffffff);
              do_recv(this_00);
              iVar17 = (int)uVar15;
              pCVar13 = (Client *)(uVar15 & 0xffffffff);
              if (iVar17 == 1) {
                pcVar10 = (this_00->_sock2stdout)._r_pos;
                pcVar9 = (this_00->_sock2stdout)._w_pos;
                if (pcVar10 == pcVar9) goto LAB_001021ab;
                lVar11 = 0x1060;
                iVar5 = 1;
LAB_0010219a:
                sVar7 = write(iVar5,*(void **)((this_00->_stdin2sock)._buf + lVar11 + -0x48),
                              (long)pcVar10 - (long)pcVar9);
                uVar16 = (uint)sVar7;
              }
              else {
                if (this_00->_sock_fd != iVar17) goto LAB_001022c4;
                pcVar10 = (this_00->_stdin2sock)._r_pos;
                pcVar9 = (this_00->_stdin2sock)._w_pos;
                lVar11 = 0x850;
                iVar5 = iVar17;
                if (pcVar10 != pcVar9) goto LAB_0010219a;
LAB_001021ab:
                uVar16 = 0;
              }
              if ((int)uVar16 < 0) {
                piVar8 = __errno_location();
                if (*piVar8 != 0xb) {
                  do_send();
LAB_001022c4:
                  do_send(pCVar13);
                  if ((pCVar13->_epoll)._maxevents < iVar17) {
                    Epoll::get();
                    halt_baddata();
                  }
                  return;
                }
              }
              else {
                fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbteys: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                        ,0xf5,"do_send",pCVar13,uVar16);
                fflush(_stderr);
                if (iVar17 == 1) {
                  pcVar10 = (this_00->_sock2stdout)._w_pos + uVar16;
                  (this_00->_sock2stdout)._w_pos = pcVar10;
                  if ((this_00->_sock2stdout)._r_pos == pcVar10) {
                    (this_00->_sock2stdout)._r_pos = (this_00->_sock2stdout)._buf;
                    (this_00->_sock2stdout)._w_pos = (this_00->_sock2stdout)._buf;
                  }
                  if ((this_00->_stdineof == true) &&
                     ((this_00->_sock2stdout)._r_pos == (this_00->_sock2stdout)._w_pos)) {
                    shutdown(this_00->_sock_fd,0);
                  }
                }
                else if ((this_00->_sock_fd == iVar17) &&
                        (pcVar10 = (this_00->_stdin2sock)._w_pos + uVar16,
                        (this_00->_stdin2sock)._w_pos = pcVar10,
                        (this_00->_stdin2sock)._r_pos == pcVar10)) {
                  (this_00->_stdin2sock)._r_pos = (this_00->_stdin2sock)._buf;
                  (this_00->_stdin2sock)._w_pos = (this_00->_stdin2sock)._buf;
                }
              }
              return;
            }
          }
        }
      }
LAB_00101e77:
      iVar17 = iVar17 + 1;
      bVar2 = iVar17 < _Var3;
    } while (iVar17 != _Var3);
  } while( true );
}

Assistant:

void Client::run()
{
    _epoll.add_event(_sock_fd, EPOLLIN);
    _epoll.add_event(STDIN_FILENO, EPOLLIN);

    
    while (true)
    {
        int nfds = _epoll.wait(kWaitMS);
        // LOG_PRINT("epoll wait get ready %d fds", nfds);

        for (int i = 0; i < nfds; ++i)
        {
            struct epoll_event &cur_ev = _epoll.get(i);

            if (cur_ev.events & EPOLLIN)
            {
                int cur_fd = cur_ev.data.fd;
                LOG_PRINT("epollin fd %d", cur_fd);
                int ret = do_recv(cur_fd);
                if (ret == err_clt_recv_normal)
                {
                    if (cur_fd == STDIN_FILENO)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd)
                    {
                        _epoll.add_event(STDOUT_FILENO, EPOLLOUT);
                    }
                }
                else if (ret == err_clt_recv_disconn || ret == err_clt_recv_svrcrash)
                {
                    return ;
                }
                else if (ret == err_clt_recv_nospace)
                {
                    if (cur_fd == STDIN_FILENO && _stdin2sock.data_size() > 0)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd && _sock2stdout.data_size() > 0)
                    {
                        int ret = _epoll.add_event(STDOUT_FILENO, EPOLLOUT);
                        if (ret < 0)
                        {
                            ret = _epoll.modify_event(STDOUT_FILENO, EPOLLOUT);
                            if (ret < 0)
                            {
                                LOG_PRINT("can't add or modify stdout to epoll_ctl");
                                exit(EXIT_FAILURE);
                            }
                        }
                    }
                }
            }
            else if (cur_ev.events & EPOLLOUT)
            {
                int cur_fd = cur_ev.data.fd;
                LOG_PRINT("epollout fd %d", cur_fd);

                int ret = do_send(cur_fd);

                if (ret == err_clt_send_shutdown_rd)
                {
                    return ;
                }
                else if (ret == err_clt_send_normal)
                {
                    if (cur_fd == STDOUT_FILENO)
                    {
                        _epoll.del_event(STDOUT_FILENO, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLIN);
                    }
                }
            }
        }
    }
}